

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::LoadScriptContextValueOpnd(Lowerer *this,Instr *instr,ScriptContextValue valueType)

{
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AddrOpnd *pAVar5;
  undefined4 *puVar6;
  intptr_t address;
  
  pSVar1 = instr->m_func->m_scriptContextInfo;
  if (valueType == ScriptContextRecycler) {
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x1c])();
    address = CONCAT44(extraout_var_00,iVar4);
  }
  else {
    if (valueType != ScriptContextNumberAllocator) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xc68,"(false)","false");
      if (bVar3) {
        *puVar6 = 0;
        return (Opnd *)0x0;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    iVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x1b])();
    address = CONCAT44(extraout_var,iVar4);
  }
  pAVar5 = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,instr->m_func,false,(Var)0x0);
  return &pAVar5->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadScriptContextValueOpnd(IR::Instr * instr, ScriptContextValue valueType)
{
    ScriptContextInfo *scriptContextInfo = instr->m_func->GetScriptContextInfo();
    switch (valueType)
    {
    case ScriptContextValue::ScriptContextNumberAllocator:
        return IR::AddrOpnd::New(scriptContextInfo->GetNumberAllocatorAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    case ScriptContextValue::ScriptContextRecycler:
        return IR::AddrOpnd::New(scriptContextInfo->GetRecyclerAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    default:
        Assert(false);
        return nullptr;
    }

}